

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::Clear(SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
        *this)

{
  int **ppiVar1;
  ValueEntry<bool,_JsUtil::(anonymous_namespace)::ValueEntryData<bool>_> **ppVVar2;
  RecyclerWeakReferenceRegionItem<Js::RecyclableObject_*> **ppRVar3;
  SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  *this_local;
  
  if (0 < this->count) {
    ppiVar1 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
    memset(*ppiVar1,0xff,(ulong)this->bucketCount << 2);
    ppVVar2 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                        ((WriteBarrierPtr *)&this->entries);
    memset(*ppVVar2,0,(long)this->size << 3);
    ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReferenceRegionItem__
                        ((WriteBarrierPtr *)&this->weakRefs);
    memset(*ppRVar3,0,(long)this->size << 4);
    this->count = 0;
    this->freeCount = 0;
  }
  return;
}

Assistant:

void Clear()
        {
            if (count > 0)
            {
                memset(buckets, -1, bucketCount * sizeof(buckets[0]));
                memset(entries, 0, sizeof(EntryType) * size);
                memset(weakRefs, 0, sizeof(WeakType) * size); // TODO: issues with background threads?
                count = 0;
                freeCount = 0;
            }
        }